

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluSemiCanonicizeVerify
               (word *pTruth,word *pTruth0,int nVars,int *pCanonPerm,uint uCanonPhase)

{
  int iVar1;
  bool bVar2;
  word *pwVar3;
  bool bVar4;
  int iVar5;
  word *pOut;
  bool bVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint iVar;
  word *pIn;
  word pGunc [1024];
  word pFunc [1024];
  
  If_CluCopy(pGunc,pTruth,nVars);
  iVar5 = 1;
  if (1 < nVars) {
    iVar5 = nVars;
  }
  bVar4 = true;
  bVar6 = false;
  uVar9 = 0;
  pwVar3 = pTruth;
  pOut = pFunc;
  do {
    while (pIn = pwVar3, uVar8 = uVar9, pwVar3 = pIn, iVar5 - 1 != uVar8) {
      iVar1 = pCanonPerm[uVar8];
      uVar9 = uVar8 + 1;
      if (pCanonPerm[uVar8 + 1] <= iVar1) {
        bVar6 = (bool)(bVar6 ^ 1);
        pCanonPerm[uVar8] = pCanonPerm[uVar8 + 1];
        pCanonPerm[uVar9] = iVar1;
        If_CluSwapAdjacent(pOut,pIn,(int)uVar8,nVars);
        bVar4 = false;
        pwVar3 = pOut;
        pOut = pIn;
      }
    }
    bVar2 = !bVar4;
    uVar9 = 0;
    bVar4 = true;
  } while (bVar2);
  if (bVar6) {
    If_CluCopy(pOut,pIn,nVars);
  }
  iVar = 0;
  uVar7 = 0;
  if (0 < nVars) {
    uVar7 = nVars;
  }
  for (; uVar7 != iVar; iVar = iVar + 1) {
    if ((uCanonPhase >> (iVar & 0x1f) & 1) != 0) {
      If_CluChangePhase(pTruth,nVars,iVar);
    }
  }
  iVar5 = If_CluEqual(pTruth0,pTruth,nVars);
  if (iVar5 == 0) {
    Kit_DsdPrintFromTruth((uint *)pTruth0,nVars);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)pGunc,nVars);
    putchar(10);
    Kit_DsdPrintFromTruth((uint *)pTruth,nVars);
    putchar(10);
    puts("SemiCanonical verification FAILED!");
  }
  return;
}

Assistant:

void If_CluSemiCanonicizeVerify( word * pTruth, word * pTruth0, int nVars, int * pCanonPerm, unsigned uCanonPhase )
{
    word pFunc[CLU_WRD_MAX], pGunc[CLU_WRD_MAX], * pIn = pTruth, * pOut = pFunc, * pTemp;
    int i, Temp, fChange, Counter = 0;
    If_CluCopy( pGunc, pTruth, nVars );
    // undo permutation
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pCanonPerm[i] < pCanonPerm[i+1] )
                continue;

            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            If_CluSwapAdjacent( pOut, pIn, i, nVars );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    if ( Counter & 1 )
        If_CluCopy( pOut, pIn, nVars );
    // undo phase
    for ( i = 0; i < nVars; i++ )
        if ( (uCanonPhase >> i) & 1 )
            If_CluChangePhase( pTruth, nVars, i );
    // compare
    if ( !If_CluEqual(pTruth0, pTruth, nVars) )
    {
        Kit_DsdPrintFromTruth( (unsigned*)pTruth0, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pGunc, nVars ); printf( "\n" );
        Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );
        printf( "SemiCanonical verification FAILED!\n" );
    }
}